

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpack.c
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  byte bVar4;
  undefined8 auStack_d88 [214];
  int local_6d4;
  int local_6d0;
  undefined4 uStack_6cc;
  int local_6c4;
  undefined1 local_6c0 [8];
  fpstate fpvar;
  char **argv_local;
  int argc_local;
  
  bVar4 = 0;
  fpvar._1696_8_ = argv;
  if (argc < 2) {
    fp_usage();
    fp_hint();
    exit(-1);
  }
  fp_init((fpstate *)local_6c0);
  fp_get_param(argc,(char **)fpvar._1696_8_,(fpstate *)local_6c0);
  if (fpvar.ntile[5]._4_4_ == 0) {
    fp_preflight(argc,(char **)fpvar._1696_8_,0,(fpstate *)local_6c0);
    auStack_d88[0xd5]._0_4_ = fpvar.preflight_checked;
    auStack_d88[0xd5]._4_4_ = fpvar._1700_4_;
    puVar2 = (undefined8 *)local_6c0;
    puVar3 = auStack_d88;
    local_6d4 = argc;
    for (lVar1 = 0xd5; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar3 = *puVar2;
      puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
      puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
    }
    fp_loop(local_6d4,auStack_d88[0xd5],0);
  }
  else {
    local_6d0 = fpvar.preflight_checked;
    uStack_6cc = fpvar._1700_4_;
    puVar2 = (undefined8 *)local_6c0;
    puVar3 = auStack_d88;
    local_6c4 = argc;
    for (lVar1 = 0xd5; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar3 = *puVar2;
      puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
      puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
    }
    fp_list(local_6c4,_local_6d0);
  }
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
	fpstate	fpvar;

	if (argc <= 1) { fp_usage (); fp_hint (); exit (-1); }

	fp_init (&fpvar);
	fp_get_param (argc, argv, &fpvar);

	if (fpvar.listonly) {
	    fp_list (argc, argv, fpvar);

	} else {
	    fp_preflight (argc, argv, FPACK, &fpvar);
	    fp_loop (argc, argv, FPACK, fpvar);
	}

	exit (0);
}